

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O2

bool __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::load
          (section_impl<ELFIO::Elf32_Shdr> *this,istream *stream,streampos header_offset,
          bool is_lazy_)

{
  element_type *peVar1;
  unique_ptr<char[],_std::default_delete<char[]>_> __p;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  undefined4 extraout_var;
  bool bVar5;
  streampos sVar6;
  unique_ptr<char[],_std::default_delete<char[]>_> decompressed_data;
  Elf_Xword uncompressed_size;
  
  this->pstream = stream;
  this->is_lazy = is_lazy_;
  if ((this->translator->addr_translations).
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->translator->addr_translations).
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::istream::seekg((long)stream,_S_beg);
    uVar4 = std::istream::tellg();
  }
  else {
    uVar4 = 0xffffffffffffffff;
  }
  (*(this->super_section)._vptr_section[0x21])(this,uVar4);
  sVar6 = address_translator::operator[](this->translator,header_offset);
  std::istream::seekg(stream,sVar6._M_off,sVar6._M_state);
  std::istream::read((char *)stream,(long)&this->header);
  bVar5 = true;
  if ((this->is_lazy == false) && (this->is_loaded == false)) {
    iVar3 = (*(this->super_section)._vptr_section[0x18])(this);
    bVar5 = CONCAT44(extraout_var,iVar3) != 0;
    bVar2 = is_compressed(this);
    if (bVar2) {
      iVar3 = (*(this->super_section)._vptr_section[0x13])(this);
      uncompressed_size = 0;
      peVar1 = (this->compression).
               super___shared_ptr<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(code **)(*(long *)peVar1 + 0x10))
                (&decompressed_data,peVar1,
                 (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl,this->convertor,iVar3);
      if ((__uniq_ptr_impl<char,_std::default_delete<char[]>_>)
          decompressed_data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0) {
        (*(this->super_section)._vptr_section[0x14])(this,&uncompressed_size);
        __p = decompressed_data;
        decompressed_data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
        std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                  ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->data,
                   (pointer)__p._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                            super__Head_base<0UL,_char_*,_false>._M_head_impl);
      }
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&decompressed_data);
    }
  }
  return bVar5;
}

Assistant:

bool load( std::istream&  stream,
               std::streampos header_offset,
               bool           is_lazy_ ) override
    {
        pstream = &stream;
        is_lazy = is_lazy_;

        if ( translator->empty() ) {
            stream.seekg( 0, std::istream::end );
            set_stream_size( size_t( stream.tellg() ) );
        }
        else {
            set_stream_size( std::numeric_limits<size_t>::max() );
        }

        stream.seekg( ( *translator )[header_offset] );
        stream.read( reinterpret_cast<char*>( &header ), sizeof( header ) );

        if ( !( is_lazy || is_loaded ) ) {
            bool ret = get_data();

            if ( is_compressed() ) {
                Elf_Xword size              = get_size();
                Elf_Xword uncompressed_size = 0;
                auto      decompressed_data = compression->inflate(
                    data.get(), convertor, size, uncompressed_size );
                if ( decompressed_data != nullptr ) {
                    set_size( uncompressed_size );
                    data = std::move( decompressed_data );
                }
            }

            return ret;
        }

        return true;
    }